

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_parser.c
# Opt level: O0

uint8_t * apx_signatureParser_parse_type_reference
                    (apx_signatureParser_t *self,uint8_t *begin,uint8_t *end)

{
  uint8_t *puVar1;
  uint8_t *result_1;
  uint32_t type_id;
  apx_error_t rc;
  uint8_t *result;
  uint8_t *puStack_30;
  uint8_t c;
  uint8_t *next;
  uint8_t *end_local;
  uint8_t *begin_local;
  apx_signatureParser_t *self_local;
  
  puStack_30 = begin;
  if (begin < end) {
    puStack_30 = begin + 1;
    if (*begin != '[') {
      return begin;
    }
    next = end;
    end_local = begin;
    begin_local = (uint8_t *)self;
    puStack_30 = bstr_lstrip(puStack_30,end);
    if (next <= puStack_30) {
      return (uint8_t *)0x0;
    }
    result._7_1_ = *puStack_30;
    if (result._7_1_ == '\"') {
      _type_id = bstr_match_pair(puStack_30,next,'\"','\"','\\');
      if (_type_id <= puStack_30) {
        return (uint8_t *)0x0;
      }
      result_1._4_4_ =
           apx_dataElement_set_type_ref_name_bstr
                     (*(apx_dataElement_t **)(*(long *)begin_local + 8),puStack_30 + 1,_type_id);
      if (result_1._4_4_ != 0) {
        apx_signatureParser_set_error
                  ((apx_signatureParser_t *)begin_local,result_1._4_4_,puStack_30);
        return (uint8_t *)0x0;
      }
      result_1._4_4_ = 0;
      puStack_30 = _type_id + 1;
    }
    else {
      puVar1 = apx_parserBase_parse_u32(puStack_30,next,(uint32_t *)&result_1);
      if (puVar1 <= puStack_30) {
        return (uint8_t *)0x0;
      }
      apx_dataElement_set_type_ref_id
                (*(apx_dataElement_t **)(*(long *)begin_local + 8),(apx_typeId_t)result_1);
      puStack_30 = puVar1;
    }
    puVar1 = bstr_lstrip(puStack_30,next);
    if (next <= puVar1) {
      return (uint8_t *)0x0;
    }
    puStack_30 = puVar1 + 1;
    if (*puVar1 != ']') {
      return (uint8_t *)0x0;
    }
  }
  return puStack_30;
}

Assistant:

static uint8_t const* apx_signatureParser_parse_type_reference(apx_signatureParser_t* self, uint8_t const* begin, uint8_t const* end)
{
   const uint8_t* next = begin;
   if (next < end)
   {
      uint8_t c;
      if (*next++ != '[')
      {
         return begin;
      }
      next = bstr_lstrip(next, end);
      if (next >= end)
      {
         return NULL;
      }
      c = *next;
      if (c == '"')
      {
         uint8_t const* result = bstr_match_pair(next, end, '"', '"', '\\');
         if (result > next)
         {
            apx_error_t rc = apx_dataElement_set_type_ref_name_bstr(self->state->data_element, next + 1, result);
            if (rc != APX_NO_ERROR)
            {
               apx_signatureParser_set_error(self, rc, next);
               return NULL;
            }
            next = result + 1;
         }
         else
         {
            return NULL;
         }
      }
      else
      {
         uint32_t type_id;
         uint8_t const* result = apx_parserBase_parse_u32(next, end, &type_id);
         if (result > next)
         {
            apx_dataElement_set_type_ref_id(self->state->data_element, type_id);
            next = result;
         }
         else
         {
            return NULL;
         }
      }
      next = bstr_lstrip(next, end);
      if (next >= end)
      {
         return NULL;
      }
      if (*next++ != ']')
      {
         return NULL;
      }
   }
   return next;
}